

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_clip_bary2(REF_DBL *orig_bary,REF_DBL *bary)

{
  double dVar1;
  double local_70;
  double local_60;
  double local_58;
  double local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  int local_30;
  int local_2c;
  REF_INT largest;
  REF_INT i;
  REF_DBL total;
  REF_DBL *bary_local;
  REF_DBL *orig_bary_local;
  
  if (0.0 < *orig_bary || *orig_bary == 0.0) {
    local_38 = *orig_bary;
  }
  else {
    local_38 = 0.0;
  }
  *bary = local_38;
  if (0.0 < orig_bary[1] || orig_bary[1] == 0.0) {
    local_40 = orig_bary[1];
  }
  else {
    local_40 = 0.0;
  }
  bary[1] = local_40;
  dVar1 = *bary + bary[1];
  if (dVar1 * 1e+20 <= 0.0) {
    local_48 = -(dVar1 * 1e+20);
  }
  else {
    local_48 = dVar1 * 1e+20;
  }
  if (*bary <= 0.0) {
    local_58 = -*bary;
  }
  else {
    local_58 = *bary;
  }
  if (local_58 < local_48) {
    if (dVar1 * 1e+20 <= 0.0) {
      local_60 = -(dVar1 * 1e+20);
    }
    else {
      local_60 = dVar1 * 1e+20;
    }
    if (bary[1] <= 0.0) {
      local_70 = -bary[1];
    }
    else {
      local_70 = bary[1];
    }
    if (local_70 < local_60) {
      *bary = *bary / dVar1;
      bary[1] = bary[1] / dVar1;
      if (*bary < 0.0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xbf5,"ref_node_clip_bary2","bary[0] not positive");
        return 1;
      }
      if (bary[1] < 0.0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xbf6,"ref_node_clip_bary2","bary[1] not positive");
        return 1;
      }
      return 0;
    }
  }
  printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n",dVar1,*orig_bary,orig_bary[1],
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xbe9,
         "ref_node_clip_bary2");
  printf("clipped bary\n%.18e %.18e\n",*bary,bary[1]);
  local_30 = 0;
  for (local_2c = 1; local_2c < 2; local_2c = local_2c + 1) {
    if (bary[local_30] <= bary[local_2c] && bary[local_2c] != bary[local_30]) {
      local_30 = local_2c;
    }
  }
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    bary[local_2c] = 0.0;
  }
  bary[local_30] = 1.0;
  printf("modified bary\n%.18e %.18e\n",*bary,bary[1]);
  return 4;
}

Assistant:

REF_FCN REF_STATUS ref_node_clip_bary2(REF_DBL *orig_bary, REF_DBL *bary) {
  REF_DBL total;

  bary[0] = MAX(0.0, orig_bary[0]);
  bary[1] = MAX(0.0, orig_bary[1]);

  total = bary[0] + bary[1];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total)) {
    bary[0] /= total;
    bary[1] /= total;
  } else {
    REF_INT i, largest;
    printf("%s: %d: %s: div zero\ntot %.18e\nbary %.18e %.18e\n", __FILE__,
           __LINE__, __func__, total, orig_bary[0], orig_bary[1]);
    printf("clipped bary\n%.18e %.18e\n", bary[0], bary[1]);
    /* chose one node */
    largest = 0;
    for (i = 1; i < 2; i++)
      if (bary[i] > bary[largest]) largest = i;
    for (i = 0; i < 2; i++) bary[i] = 0.0;
    bary[largest] = 1.0;
    printf("modified bary\n%.18e %.18e\n", bary[0], bary[1]);
    return REF_DIV_ZERO;
  }

  RAS(bary[0] >= 0.0, "bary[0] not positive");
  RAS(bary[1] >= 0.0, "bary[1] not positive");

  return REF_SUCCESS;
}